

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XPathMatcher::XPathMatcher
          (XPathMatcher *this,XercesXPath *xpath,MemoryManager *manager)

{
  CleanupType_conflict26 cleanup;
  JanitorMemFunCall<xercesc_4_0::XPathMatcher> local_20;
  
  this->_vptr_XPathMatcher = (_func_int **)&PTR__XPathMatcher_00407bf8;
  this->fLocationPathSize = 0;
  this->fMatched = (uchar *)0x0;
  this->fNoMatchDepth = (XMLSize_t *)0x0;
  this->fCurrentStep = (XMLSize_t *)0x0;
  this->fIdentityConstraint = (IdentityConstraint *)0x0;
  this->fStepIndexes = (RefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_> *)0x0;
  this->fLocationPaths = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0;
  this->fMemoryManager = manager;
  local_20.fToCall = (MFPT)cleanUp;
  local_20._16_8_ = 0;
  local_20.fObject = this;
  init(this,(EVP_PKEY_CTX *)xpath);
  local_20.fObject = (XPathMatcher *)0x0;
  JanitorMemFunCall<xercesc_4_0::XPathMatcher>::~JanitorMemFunCall(&local_20);
  return;
}

Assistant:

XPathMatcher::XPathMatcher( XercesXPath* const xpath
                          , MemoryManager* const manager)
    : fLocationPathSize(0)
    , fMatched(0)
    , fNoMatchDepth(0)
    , fCurrentStep(0)
    , fStepIndexes(0)
    , fLocationPaths(0)
    , fIdentityConstraint(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XPathMatcher::cleanUp);

    try {
        init(xpath);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}